

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

int __thiscall
TPZMatrix<std::complex<long_double>_>::Decompose_Cholesky
          (TPZMatrix<std::complex<long_double>_> *this)

{
  char cVar1;
  int iVar2;
  int extraout_var;
  long lVar4;
  complex<long_double> *__z;
  int64_t k;
  long lVar5;
  long lVar6;
  int64_t k_1;
  long lVar7;
  longdouble in_ST0;
  longdouble lVar8;
  longdouble in_ST1;
  longdouble lVar9;
  longdouble lVar10;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  complex<long_double> __r;
  complex<long_double> local_e8;
  complex<long_double> tmp2;
  complex<long_double> tmp;
  undefined1 local_58 [40];
  long lVar3;
  
  cVar1 = (this->super_TPZBaseMatrix).fDecomposed;
  if ((cVar1 != '\0') && (cVar1 != '\x03')) {
    Error("Decompose_Cholesky <Matrix already Decomposed>",(char *)0x0);
    cVar1 = (this->super_TPZBaseMatrix).fDecomposed;
  }
  if (cVar1 == '\0') {
    if ((this->super_TPZBaseMatrix).fRow != (this->super_TPZBaseMatrix).fCol) {
      Error("Decompose_Cholesky <Matrix must be square>",(char *)0x0);
    }
    iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
    lVar3 = CONCAT44(extraout_var,iVar2);
    lVar4 = 0;
    if (lVar3 != 0 && -1 < extraout_var) {
      lVar4 = lVar3;
    }
    lVar5 = 0;
    while (lVar7 = lVar5, lVar7 != lVar4) {
      for (lVar5 = 0; lVar7 != lVar5; lVar5 = lVar5 + 1) {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&tmp,this,lVar7,lVar5);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&local_e8,this,lVar7,lVar5);
        lVar8 = -(longdouble)CONCAT28(local_e8._M_value._24_2_,local_e8._M_value._16_8_);
        tmp2._M_value._0_4_ = local_e8._M_value._0_4_;
        tmp2._M_value._4_4_ = local_e8._M_value._4_4_;
        tmp2._M_value._8_2_ = local_e8._M_value._8_2_;
        tmp2._M_value._16_4_ = SUB104(lVar8,0);
        tmp2._M_value._20_4_ = SUB104((unkuint10)lVar8 >> 0x20,0);
        tmp2._M_value._24_2_ = SUB102((unkuint10)lVar8 >> 0x40,0);
        __r._M_value._0_4_ = tmp._M_value._0_4_;
        __r._M_value._4_4_ = tmp._M_value._4_4_;
        __r._M_value._8_2_ = tmp._M_value._8_2_;
        __r._M_value._10_2_ = tmp._M_value._10_2_;
        __r._M_value._16_4_ = tmp._M_value._16_4_;
        __r._M_value._20_4_ = tmp._M_value._20_4_;
        __r._M_value._24_2_ = tmp._M_value._24_2_;
        __r._M_value._26_2_ = tmp._M_value._26_2_;
        std::complex<long_double>::operator*=(&__r,&tmp2);
        lVar8 = (longdouble)
                CONCAT28(__r._M_value._8_2_,CONCAT44(__r._M_value._4_4_,__r._M_value._0_4_));
        lVar9 = (longdouble)
                CONCAT28(__r._M_value._24_2_,CONCAT44(__r._M_value._20_4_,__r._M_value._16_4_));
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&tmp,this,lVar7,lVar7);
        __r._M_value._8_2_ = tmp._M_value._8_2_;
        __r._M_value._10_2_ = tmp._M_value._10_2_;
        __r._M_value._12_4_ = tmp._M_value._12_4_;
        __r._M_value._24_2_ = tmp._M_value._24_2_;
        __r._M_value._26_2_ = tmp._M_value._26_2_;
        __r._M_value._28_4_ = tmp._M_value._28_4_;
        lVar8 = (longdouble)
                CONCAT28(__r._M_value._8_2_,CONCAT44(tmp._M_value._4_4_,tmp._M_value._0_4_)) -
                (lVar8 + (longdouble)0);
        lVar9 = (longdouble)
                CONCAT28(__r._M_value._24_2_,CONCAT44(tmp._M_value._20_4_,tmp._M_value._16_4_)) -
                (lVar9 + (longdouble)0);
        __r._M_value._0_4_ = SUB104(lVar8,0);
        __r._M_value._4_4_ = SUB104((unkuint10)lVar8 >> 0x20,0);
        __r._M_value._8_2_ = SUB102((unkuint10)lVar8 >> 0x40,0);
        __r._M_value._16_4_ = SUB104(lVar9,0);
        __r._M_value._20_4_ = SUB104((unkuint10)lVar9 >> 0x20,0);
        __r._M_value._24_2_ = SUB102((unkuint10)lVar9 >> 0x40,0);
        in_ST5 = in_ST4;
        in_ST6 = in_ST4;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar7,lVar7,&__r);
      }
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(&__r,this,lVar7,lVar7);
      std::sqrt<long_double>(&tmp,&__r);
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])(this,lVar7,lVar7,&tmp);
      for (lVar6 = lVar7 + 1; lVar5 = lVar7 + 1, lVar6 < lVar3; lVar6 = lVar6 + 1) {
        lVar8 = in_ST0;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        for (lVar5 = 0; lVar7 != lVar5; lVar5 = lVar5 + 1) {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&tmp2,this,lVar7,lVar5);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (local_58,this,lVar6,lVar5);
          local_e8._M_value._0_8_ = SUB108(local_58._0_10_,0);
          local_e8._M_value._8_2_ = SUB102(local_58._0_10_,8);
          local_e8._M_value._16_8_ = SUB108(-(longdouble)local_58._16_10_,0);
          local_e8._M_value._24_2_ = SUB102((unkuint10)-(longdouble)local_58._16_10_ >> 0x40,0);
          __r._M_value._0_4_ = tmp2._M_value._0_4_;
          __r._M_value._4_4_ = tmp2._M_value._4_4_;
          __r._M_value._8_2_ = tmp2._M_value._8_2_;
          __r._M_value._16_4_ = tmp2._M_value._16_4_;
          __r._M_value._20_4_ = tmp2._M_value._20_4_;
          __r._M_value._24_2_ = tmp2._M_value._24_2_;
          std::complex<long_double>::operator*=(&__r,&local_e8);
          lVar9 = (longdouble)
                  CONCAT28(__r._M_value._8_2_,CONCAT44(__r._M_value._4_4_,__r._M_value._0_4_));
          lVar10 = (longdouble)
                   CONCAT28(__r._M_value._24_2_,CONCAT44(__r._M_value._20_4_,__r._M_value._16_4_));
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&tmp2,this,lVar7,lVar6);
          __r._M_value._10_2_ = tmp2._M_value._10_2_;
          __r._M_value._12_4_ = tmp2._M_value._12_4_;
          __r._M_value._26_2_ = tmp2._M_value._26_2_;
          __r._M_value._28_4_ = tmp2._M_value._28_4_;
          lVar9 = (longdouble)
                  CONCAT28(tmp2._M_value._8_2_,CONCAT44(tmp2._M_value._4_4_,tmp2._M_value._0_4_)) -
                  (lVar9 + (longdouble)0);
          lVar10 = (longdouble)
                   CONCAT28(tmp2._M_value._24_2_,CONCAT44(tmp2._M_value._20_4_,tmp2._M_value._16_4_)
                           ) - (lVar10 + (longdouble)0);
          __r._M_value._0_4_ = SUB104(lVar9,0);
          __r._M_value._4_4_ = SUB104((unkuint10)lVar9 >> 0x20,0);
          __r._M_value._8_2_ = SUB102((unkuint10)lVar9 >> 0x40,0);
          __r._M_value._16_4_ = SUB104(lVar10,0);
          __r._M_value._20_4_ = SUB104((unkuint10)lVar10 >> 0x20,0);
          __r._M_value._24_2_ = SUB102((unkuint10)lVar10 >> 0x40,0);
          in_ST4 = in_ST3;
          in_ST5 = in_ST3;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,lVar7,lVar6,&__r);
        }
        __z = (complex<long_double> *)this;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&tmp2,this,lVar7,lVar7);
        __r._M_value._16_4_ = tmp2._M_value._16_4_;
        __r._M_value._20_4_ = tmp2._M_value._20_4_;
        __r._M_value._24_2_ = tmp2._M_value._24_2_;
        __r._M_value._0_4_ = tmp2._M_value._0_4_;
        __r._M_value._4_4_ = tmp2._M_value._4_4_;
        __r._M_value._8_2_ = tmp2._M_value._8_2_;
        std::abs<long_double>((longdouble *)&__r,__z);
        if (ABS(lVar8) < (longdouble)1e-16) {
          Error("Decompose_Cholesky <Zero on diagonal>",(char *)0x0);
        }
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&local_e8,this,lVar7,lVar6);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  ((complex<long_double> *)local_58,this,lVar7,lVar7);
        __r._M_value._16_4_ = local_e8._M_value._16_4_;
        __r._M_value._20_4_ = local_e8._M_value._20_4_;
        __r._M_value._24_2_ = local_e8._M_value._24_2_;
        __r._M_value._26_2_ = local_e8._M_value._26_2_;
        __r._M_value._28_4_ = local_e8._M_value._28_4_;
        __r._M_value._0_4_ = local_e8._M_value._0_4_;
        __r._M_value._4_4_ = local_e8._M_value._4_4_;
        __r._M_value._8_2_ = local_e8._M_value._8_2_;
        __r._M_value._10_2_ = local_e8._M_value._10_2_;
        __r._M_value._12_4_ = local_e8._M_value._12_4_;
        std::complex<long_double>::operator/=(&__r,(complex<long_double> *)local_58);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar7,lVar6,&__r);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&local_e8,this,lVar7,lVar6);
        lVar8 = -(longdouble)CONCAT28(local_e8._M_value._24_2_,local_e8._M_value._16_8_);
        __r._M_value._0_4_ = local_e8._M_value._0_4_;
        __r._M_value._4_4_ = local_e8._M_value._4_4_;
        __r._M_value._8_2_ = local_e8._M_value._8_2_;
        __r._M_value._16_4_ = SUB104(lVar8,0);
        __r._M_value._20_4_ = SUB104((unkuint10)lVar8 >> 0x20,0);
        __r._M_value._24_2_ = SUB102((unkuint10)lVar8 >> 0x40,0);
        in_ST6 = in_ST5;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar6,lVar7,&__r);
      }
    }
    (this->super_TPZBaseMatrix).fDecomposed = '\x03';
  }
  return 3;
}

Assistant:

int TPZMatrix<TVar>::Decompose_Cholesky() {
	if (  fDecomposed && fDecomposed != ECholesky) Error( "Decompose_Cholesky <Matrix already Decomposed>" );
	if (  fDecomposed ) return ECholesky;
	if ( Rows()!=Cols() ) Error( "Decompose_Cholesky <Matrix must be square>" );
	//return 0;
	
	int64_t dim=Dim();
	for (int64_t i=0 ; i<dim; i++) {
		for(int64_t k=0; k<i; k++) {//diagonal elements
            TVar sum = 0;
            if constexpr (is_complex<TVar>::value){
                sum += GetVal(i,k)*std::conj(GetVal(i,k));
            }else{
                sum += GetVal(i,k)*GetVal(i,k);
            }
            PutVal( i,i,GetVal(i,i)-sum );
		}
		TVar tmp = sqrt(GetVal(i,i));
        PutVal( i,i,tmp );
        for (int64_t j=i+1;j<dim; j++) {//off-diagonal elements
            for(int64_t k=0; k<i; k++) {
                TVar sum = 0.;
                if constexpr (is_complex<TVar>::value){
                    sum += GetVal(i,k)*std::conj(GetVal(j,k));
                }else{
                    sum += GetVal(i,k)*GetVal(j,k);
                }
                PutVal( i,j,GetVal(i,j)-sum);
            }
            TVar tmp2 = GetVal(i,i);
            if ( IsZero(tmp2) ) {
				Error( "Decompose_Cholesky <Zero on diagonal>" );
            }
            PutVal(i,j,GetVal(i,j)/GetVal(i,i) );
            if constexpr (is_complex<TVar>::value){
                PutVal(j,i,std::conj(GetVal(i,j)));
            }else{
                PutVal(j,i,GetVal(i,j));
            }
        }
    }
	fDecomposed = ECholesky;
	return ECholesky;
	
}